

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_tctable_decl.h
# Opt level: O2

uint32_t google::protobuf::internal::TcParseTableBase::RecodeTagForFastParsing(uint32_t tag)

{
  uint32_t uVar1;
  Nullable<const_char_*> failure_msg;
  uint local_1c;
  LogMessageFatal local_18;
  
  local_1c = 0x3fff;
  local_18.super_LogMessage.errno_saver_.saved_errno_ = tag;
  failure_msg = absl::lts_20250127::log_internal::Check_LEImpl<unsigned_int,unsigned_int>
                          ((uint *)&local_18,&local_1c,"tag <= 0x3FFFu");
  if (failure_msg == (Nullable<const_char_*>)0x0) {
    uVar1 = tag + 0x80 + (tag & 0xffffff80);
    if ((tag & 0xffffff80) == 0) {
      uVar1 = tag;
    }
    return uVar1;
  }
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            (&local_18,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_decl.h"
             ,0x179,failure_msg);
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal(&local_18);
}

Assistant:

static uint32_t RecodeTagForFastParsing(uint32_t tag) {
    ABSL_DCHECK_LE(tag, 0x3FFFu);
    // Construct the varint-coded tag. If it is more than 7 bits, we need to
    // shift the high bits and add a continue bit.
    uint32_t hibits = tag & 0xFFFFFF80;
    if (hibits != 0) {
      // hi = tag & ~0x7F
      // lo = tag & 0x7F
      // This shifts hi to the left by 1 to the next byte and sets the
      // continuation bit.
      tag = tag + hibits + 0x80;
    }
    return tag;
  }